

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

VCFilter * __thiscall VCProjectSingleConfig::filterByName(VCProjectSingleConfig *this,QString *name)

{
  bool bVar1;
  VCFilter *pVVar2;
  
  bVar1 = comparesEqual(name,"Root Files");
  if (bVar1) {
    pVVar2 = &this->RootFiles;
  }
  else {
    bVar1 = comparesEqual(name,"Source Files");
    if (bVar1) {
      pVVar2 = &this->SourceFiles;
    }
    else {
      bVar1 = comparesEqual(name,"Header Files");
      if (bVar1) {
        pVVar2 = &this->HeaderFiles;
      }
      else {
        bVar1 = comparesEqual(name,"Generated Files");
        if (bVar1) {
          pVVar2 = &this->GeneratedFiles;
        }
        else {
          bVar1 = comparesEqual(name,"LexYacc Files");
          if (bVar1) {
            pVVar2 = &this->LexYaccFiles;
          }
          else {
            bVar1 = comparesEqual(name,"Translation Files");
            if (bVar1) {
              pVVar2 = &this->TranslationFiles;
            }
            else {
              bVar1 = comparesEqual(name,"Form Files");
              if (bVar1) {
                pVVar2 = &this->FormFiles;
              }
              else {
                bVar1 = comparesEqual(name,"Resource Files");
                if (bVar1) {
                  pVVar2 = &this->ResourceFiles;
                }
                else {
                  bVar1 = comparesEqual(name,"Deployment Files");
                  if (bVar1) {
                    pVVar2 = &this->DeploymentFiles;
                  }
                  else {
                    bVar1 = comparesEqual(name,"Distribution Files");
                    if (!bVar1) {
                      pVVar2 = filterForExtraCompiler(this,name);
                      return pVVar2;
                    }
                    pVVar2 = &this->DistributionFiles;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pVVar2;
}

Assistant:

const VCFilter &VCProjectSingleConfig::filterByName(const QString &name) const
{
    if (name == "Root Files")
        return RootFiles;
    if (name == "Source Files")
        return SourceFiles;
    if (name == "Header Files")
        return HeaderFiles;
    if (name == "Generated Files")
        return GeneratedFiles;
    if (name == "LexYacc Files")
        return LexYaccFiles;
    if (name == "Translation Files")
        return TranslationFiles;
    if (name == "Form Files")
        return FormFiles;
    if (name == "Resource Files")
        return ResourceFiles;
    if (name == "Deployment Files")
        return DeploymentFiles;
    if (name == "Distribution Files")
        return DistributionFiles;
    return filterForExtraCompiler(name);
}